

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

GCRef * gc_sweep(global_State *g,GCRef *p,uint32_t lim)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  GCobj *pGVar5;
  
  bVar1 = (g->gc).currentwhite;
  do {
    iVar4 = -lim;
    while( true ) {
      iVar4 = iVar4 + 1;
      uVar2 = (((GChead *)p)->nextgc).gcptr32;
      pGVar5 = (GCobj *)(ulong)uVar2;
      if ((pGVar5 == (GCobj *)0x0) || (iVar4 == 1)) {
        return (GCRef *)(GCobj *)p;
      }
      if ((pGVar5->gch).gct == '\x06') {
        gc_sweep(g,(GCRef *)((long)pGVar5 + 0x28),0x7fffff00);
      }
      if ((byte)((*(byte *)((long)pGVar5 + 4) ^ 3) & (bVar1 ^ 3)) != 0) break;
      uVar3 = (pGVar5->gch).nextgc.gcptr32;
      (((GChead *)p)->nextgc).gcptr32 = uVar3;
      if (uVar2 == (g->gc).root.gcptr32) {
        (g->gc).root.gcptr32 = uVar3;
      }
      (*gc_freefunc[(pGVar5->gch).gct - 4])(g,pGVar5);
    }
    *(byte *)((long)pGVar5 + 4) = (g->gc).currentwhite & 3 | *(byte *)((long)pGVar5 + 4) & 0xf8;
    lim = -iVar4;
    p = (GCRef *)pGVar5;
  } while( true );
}

Assistant:

static GCRef *gc_sweep(global_State *g, GCRef *p, uint32_t lim)
{
  /* Mask with other white and LJ_GC_FIXED. Or LJ_GC_SFIXED on shutdown. */
  int ow = otherwhite(g);
  GCobj *o;
  while ((o = gcref(*p)) != NULL && lim-- > 0) {
    if (o->gch.gct == ~LJ_TTHREAD)  /* Need to sweep open upvalues, too. */
      gc_fullsweep(g, &gco2th(o)->openupval);
    if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* Black or current white? */
      lua_assert(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED));
      makewhite(g, o);  /* Value is alive, change to the current white. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise value is dead, free it. */
      lua_assert(isdead(g, o) || ow == LJ_GC_SFIXED);
      setgcrefr(*p, o->gch.nextgc);
      if (o == gcref(g->gc.root))
	setgcrefr(g->gc.root, o->gch.nextgc);  /* Adjust list anchor. */
      gc_freefunc[o->gch.gct - ~LJ_TSTR](g, o);
    }
  }
  return p;
}